

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

string * __thiscall
pbrt::HaltonSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,HaltonSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pstd::vector<pbrt::DigitPermutation,pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>>*const&,pbrt::HaltonPixelIndexer_const&,pbrt::Point2<int>const&,int_const&,int_const&,int_const&>
            (__return_storage_ptr__,
             "[ HaltonSampler digitPermutations: %p haltonPixelIndexer: %s pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d ]"
             ,&this->digitPermutations,&this->haltonPixelIndexer,&this->pixel,&this->sampleIndex,
             &this->dimension,&this->samplesPerPixel);
  return __return_storage_ptr__;
}

Assistant:

std::string HaltonSampler::ToString() const {
    return StringPrintf("[ HaltonSampler digitPermutations: %p haltonPixelIndexer: %s "
                        "pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d ]",
                        digitPermutations, haltonPixelIndexer, pixel, sampleIndex,
                        dimension, samplesPerPixel);
}